

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

unique_ptr<float[],_std::default_delete<float[]>_> __thiscall
qclab::dense::alloc_unique_array<float>(dense *this,int64_t size)

{
  void *pvVar1;
  __uniq_ptr_impl<float,_std::default_delete<float[]>_> local_10;
  
  if (0 < size) {
    pvVar1 = operator_new__(-(ulong)((ulong)size >> 0x3e != 0) | size << 2);
    *(void **)this = pvVar1;
    local_10._M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
    super__Head_base<0UL,_float_*,_false>._M_head_impl =
         (tuple<float_*,_std::default_delete<float[]>_>)
         (_Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>)0x0;
    std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
              ((unique_ptr<float[],_std::default_delete<float[]>_> *)&local_10);
    return (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)
           (__uniq_ptr_data<float,_std::default_delete<float[]>,_true,_true>)this;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = float]");
}

Assistant:

inline auto alloc_unique_array( const int64_t size ) {
      assert( size > 0 ) ;
      std::unique_ptr< T[] > mem( new T[size] ) ;
      assert( mem.get() != nullptr ) ;
      return mem ;
    }